

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O0

void SCurvePosCtrl_SetNewPos
               (SCurvePosCtrl_t *pSCurvePosCtrl,float cycle,float max_spd,float acc,float finish_pos
               )

{
  float finish_pos_local;
  float acc_local;
  float max_spd_local;
  float cycle_local;
  SCurvePosCtrl_t *pSCurvePosCtrl_local;
  
  pSCurvePosCtrl->Time = 0.0;
  pSCurvePosCtrl->Cycle = cycle;
  pSCurvePosCtrl->Acc = acc;
  pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
  pSCurvePosCtrl->MaxSpd = max_spd;
  pSCurvePosCtrl->OriginPos = pSCurvePosCtrl->Pos;
  pSCurvePosCtrl->FinishPos = finish_pos;
  pSCurvePosCtrl->DeltaPos = pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos;
  if (ABS(pSCurvePosCtrl->Cycle) <= 0.0001) {
    SCurvePosCtrl_MaxSpdLimited(pSCurvePosCtrl);
  }
  else {
    SCurvePosCtrl_CycleLimited(pSCurvePosCtrl);
  }
  return;
}

Assistant:

void SCurvePosCtrl_SetNewPos(SCurvePosCtrl_t *pSCurvePosCtrl, float cycle, float max_spd, float acc, float finish_pos)
{
	pSCurvePosCtrl->Time = 0.0f;
	pSCurvePosCtrl->Cycle = cycle;
	pSCurvePosCtrl->Acc = acc;
	pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
	pSCurvePosCtrl->MaxSpd = max_spd;
	pSCurvePosCtrl->OriginPos = pSCurvePosCtrl->Pos;
	pSCurvePosCtrl->FinishPos = finish_pos;

	pSCurvePosCtrl->DeltaPos = pSCurvePosCtrl->FinishPos - pSCurvePosCtrl->OriginPos;

	if (fabs(pSCurvePosCtrl->Cycle) > SCURVE_EQUAL_ERROR)
	{
		SCurvePosCtrl_CycleLimited(pSCurvePosCtrl);
	}
	else
	{
		SCurvePosCtrl_MaxSpdLimited(pSCurvePosCtrl);
	}
}